

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref.cpp
# Opt level: O3

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  MPP_RET MVar5;
  int iVar6;
  MPP_RET MVar7;
  MPP_RET MVar8;
  MPP_RET MVar9;
  MPP_RET MVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int *piVar19;
  MppEncRefs refs;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  MppEncRefs local_38;
  
  MVar5 = _check_is_mpp_enc_ref_cfg("mpp_enc_ref_cfg_check",ref);
  if (MVar5 != MPP_OK) {
    return MPP_ERR_VALUE;
  }
  uVar17 = *(uint *)((long)ref + 0x1c);
  uVar1 = *(uint *)((long)ref + 0x20);
  local_4c = 0;
  local_54 = 0;
  local_50 = 0;
  local_48 = 0;
  if (0 < (int)uVar17) {
    piVar19 = (int *)(*(long *)((long)ref + 0x28) + 0x14);
    bVar3 = true;
    local_48 = 0;
    local_50 = 0;
    uVar16 = 0;
    local_54 = 0;
    uVar15 = 0;
    do {
      uVar14 = piVar19[-3];
      iVar6 = piVar19[-5];
      iVar11 = piVar19[-4];
      uVar13 = 1 << ((byte)iVar6 & 0x1f);
      if (0xf < iVar6) {
        bVar3 = false;
        _mpp_log_l(2,"mpp_enc_ref",
                   "ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n"
                   ,"mpp_enc_ref_cfg_check",ref,uVar15,iVar6);
      }
      uVar12 = uVar13;
      if ((uVar13 & uVar16) != 0) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                   "mpp_enc_ref_cfg_check",ref,uVar15,iVar6);
        uVar12 = 0;
        bVar3 = false;
      }
      local_48 = local_48 + (uint)((uVar13 & uVar16) == 0);
      if (local_50 < iVar6) {
        local_50 = iVar6;
      }
      if (iVar11 != 0) {
        bVar3 = false;
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                   "mpp_enc_ref_cfg_check",ref,uVar15,iVar11);
      }
      if ((6 < uVar14) && (uVar14 != 0x19)) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p lt cfg %d with invalid ref mode %x\n",
                   "mpp_enc_ref_cfg_check",ref,uVar15,uVar14);
        goto LAB_0014e89f;
      }
      if (!bVar3) goto LAB_0014e89f;
      if ((piVar19[-1] != 0) && (iVar6 = piVar19[-1] + *piVar19, local_54 < iVar6)) {
        local_54 = iVar6;
      }
      uVar16 = uVar16 | uVar12;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
      piVar19 = piVar19 + 6;
    } while (uVar17 != uVar14);
  }
  if ((int)uVar1 < 1) {
    iVar11 = -1;
    iVar6 = 0;
  }
  else {
    piVar19 = (int *)(*(long *)((long)ref + 0x30) + 0x10);
    bVar4 = true;
    bVar3 = true;
    uVar15 = 0;
    local_4c = 0;
    iVar6 = 0;
    uVar17 = 0;
    iVar11 = 0;
    do {
      iVar2 = piVar19[-3];
      uVar16 = piVar19[-2];
      uVar14 = 1 << ((byte)iVar2 & 0x1f);
      iVar18 = (int)uVar15;
      if (3 < iVar2) {
        bVar4 = false;
        _mpp_log_l(2,"mpp_enc_ref",
                   "ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n"
                   ,"mpp_enc_ref_cfg_check",ref,uVar15,iVar2);
      }
      if ((6 < uVar16) && (uVar16 != 0x1d)) {
        bVar4 = false;
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with invalid ref mode %x\n",
                   "mpp_enc_ref_cfg_check",ref,uVar15,uVar16);
      }
      if (*piVar19 < 0) {
        _mpp_log_l(2,"mpp_enc_ref","ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                   "mpp_enc_ref_cfg_check",ref,uVar15,*piVar19);
        *piVar19 = 0;
      }
      if (iVar18 - uVar1 == -1 || iVar18 == 0) {
        if (piVar19[-4] != 0) {
          bVar4 = false;
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                     "mpp_enc_ref_cfg_check",ref,uVar15);
        }
        if (0 < iVar2) {
          _mpp_log_l(2,"mpp_enc_ref",
                     "ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n"
                     ,"mpp_enc_ref_cfg_check",ref,uVar15,iVar2);
          break;
        }
      }
      if (!bVar4) break;
      bVar3 = (uVar14 & uVar17) == 0;
      if (!bVar3 || piVar19[-4] != 0) {
        uVar14 = 0;
      }
      uVar17 = uVar17 | uVar14;
      local_4c = local_4c + (uint)(bVar3 && piVar19[-4] == 0);
      if (iVar6 < iVar2) {
        iVar6 = iVar2;
      }
      iVar11 = iVar11 + *piVar19 + 1;
      uVar16 = iVar18 + 1;
      uVar15 = (ulong)uVar16;
      bVar3 = (int)uVar16 < (int)uVar1;
      piVar19 = piVar19 + 5;
    } while (uVar16 != uVar1);
    if (bVar3) {
LAB_0014e89f:
      uVar17 = 0;
      _mpp_log_l(2,"mpp_enc_ref","check ref cfg %p failed\n","mpp_enc_ref_cfg_check",ref);
      goto LAB_0014e9a1;
    }
    iVar11 = iVar11 + -1;
  }
  local_38 = (MppEncRefs)0x0;
  *(undefined4 *)((long)ref + 0x38) = 0;
  *(int *)((long)ref + 0x3c) = local_48;
  *(int *)((long)ref + 0x40) = local_4c;
  *(int *)((long)ref + 0x44) = local_50;
  *(int *)((long)ref + 0x48) = iVar6;
  *(int *)((long)ref + 0x4c) = local_54;
  *(int *)((long)ref + 0x50) = iVar11;
  MVar5 = mpp_enc_refs_init(&local_38);
  MVar7 = mpp_enc_refs_set_cfg(local_38,ref);
  MVar8 = mpp_enc_refs_dryrun(local_38);
  MVar9 = mpp_enc_refs_get_cpb_info(local_38,(MppEncCpbInfo *)((long)ref + 0x38));
  MVar10 = mpp_enc_refs_deinit(&local_38);
  uVar17 = (uint)(((MVar8 == MPP_OK && MVar7 == MPP_OK) && (MVar10 == MPP_OK && MVar9 == MPP_OK)) &&
                 MVar5 == MPP_OK);
LAB_0014e9a1:
  *(uint *)((long)ref + 8) = uVar17;
  return uVar17 + MPP_NOK;
}

Assistant:

MPP_RET mpp_enc_ref_cfg_check(MppEncRefCfg ref)
{
    if (check_is_mpp_enc_ref_cfg(ref))
        return MPP_ERR_VALUE;

    MppEncRefCfgImpl *p = (MppEncRefCfgImpl *)ref;
    RK_S32 lt_cfg_cnt = p->lt_cfg_cnt;
    RK_S32 st_cfg_cnt = p->st_cfg_cnt;
    RK_S32 max_lt_ref_cnt   = 0;
    RK_S32 max_lt_ref_idx   = 0;
    RK_S32 lt_idx_used_mask = 0;
    RK_S32 lt_dryrun_length = 0;
    RK_S32 max_st_ref_cnt   = 0;
    RK_S32 max_st_tid       = 0;
    RK_S32 st_tid_used_mask = 0;
    RK_S32 st_dryrun_length = 0;
    RK_S32 ready = 1;

    /* parse and check gop config for encoder */
    if (lt_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefLtFrmCfg *cfg = p->lt_cfg;

        for (pos = 0; pos < lt_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_S32 lt_idx = cfg->lt_idx;
            RK_U32 lt_idx_mask = 1 << lt_idx;

            /* check lt idx */
            if (lt_idx >= MPP_ENC_MAX_LT_REF_NUM) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid lt_idx %d larger than MPP_ENC_MAX_LT_REF_NUM\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (lt_idx_used_mask & lt_idx_mask) {
                mpp_err_f("ref cfg %p lt cfg %d with redefined lt_idx %d config\n",
                          ref, pos, lt_idx);
                ready = 0;
            }

            if (!(lt_idx_used_mask & lt_idx_mask)) {
                lt_idx_used_mask |= lt_idx_mask;
                max_lt_ref_cnt++;
            }

            if (lt_idx > max_lt_ref_idx)
                max_lt_ref_idx = lt_idx;

            /* check temporal id */
            if (temporal_id != 0) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid temporal_id %d is non-zero\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_LT_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p lt cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            /* if check failed just quit */
            if (!ready)
                break;

            if (cfg->lt_gap && (cfg->lt_gap + cfg->lt_delay > lt_dryrun_length))
                lt_dryrun_length = cfg->lt_gap + cfg->lt_delay;
        }
    }

    /* check st-ref config */
    if (ready && st_cfg_cnt) {
        RK_S32 pos = 0;
        MppEncRefStFrmCfg *cfg = p->st_cfg;

        for (pos = 0; pos < st_cfg_cnt; pos++, cfg++) {
            MppEncRefMode ref_mode = cfg->ref_mode;
            RK_S32 temporal_id = cfg->temporal_id;
            RK_U32 tid_mask = 1 << temporal_id;

            /* check temporal_id */
            if (temporal_id > MPP_ENC_MAX_TEMPORAL_LAYER_NUM - 1) {
                mpp_err_f("ref cfg %p st cfg %d with invalid temporal_id %d larger than MPP_ENC_MAX_TEMPORAL_LAYER_NUM\n",
                          ref, pos, temporal_id);
                ready = 0;
            }

            /* check gop mode */
            if (!REF_MODE_IS_GLOBAL(ref_mode) && !REF_MODE_IS_ST_MODE(ref_mode)) {
                mpp_err_f("ref cfg %p st cfg %d with invalid ref mode %x\n",
                          ref, pos, ref_mode);
                ready = 0;
            }

            if (cfg->repeat < 0) {
                mpp_err_f("ref cfg %p st cfg %d with negative repeat %d set to zero\n",
                          ref, pos, cfg->repeat);
                cfg->repeat = 0;
            }

            /* constrain on head and tail frame */
            if (pos == 0 || (pos == st_cfg_cnt - 1)) {
                if (cfg->is_non_ref) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-ref frame on head/tail frame\n",
                              ref, pos);
                    ready = 0;
                }

                if (temporal_id > 0) {
                    mpp_err_f("ref cfg %p st cfg %d with invalid non-zero temporal id %d on head/tail frame\n",
                              ref, pos, temporal_id);
                    ready = 0;
                }
            }

            if (!ready)
                break;

            if (!cfg->is_non_ref && !(st_tid_used_mask & tid_mask)) {
                max_st_ref_cnt++;
                st_tid_used_mask |= tid_mask;
            }

            if (temporal_id > max_st_tid)
                max_st_tid = temporal_id;

            st_dryrun_length++;
            st_dryrun_length += cfg->repeat;
        }
    }

    if (ready) {
        MppEncCpbInfo *cpb_info = &p->cpb_info;
        MppEncRefs refs = NULL;
        MPP_RET ret = MPP_OK;

        cpb_info->dpb_size = 0;
        cpb_info->max_lt_cnt = max_lt_ref_cnt;
        cpb_info->max_st_cnt = max_st_ref_cnt;
        cpb_info->max_lt_idx = max_lt_ref_idx;
        cpb_info->max_st_tid = max_st_tid;
        cpb_info->lt_gop     = lt_dryrun_length;
        cpb_info->st_gop     = st_dryrun_length - 1;

        ret = mpp_enc_refs_init(&refs);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_set_cfg(refs, ref);
        ready = (ret) ? 0 : (ready);
        ret = mpp_enc_refs_dryrun(refs);
        ready = (ret) ? 0 : (ready);

        /* update dpb size */
        ret = mpp_enc_refs_get_cpb_info(refs, cpb_info);
        ready = (ret) ? 0 : (ready);

        ret = mpp_enc_refs_deinit(&refs);
        ready = (ret) ? 0 : (ready);
    } else {
        mpp_err_f("check ref cfg %p failed\n", ref);
    }
    p->ready = ready;

    return ready ? MPP_OK : MPP_NOK;
}